

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.h
# Opt level: O0

void enqueue_lf_jobs(AV1LfSync *lf_sync,int start,int stop,int *planes_to_lf,int lpf_opt_level,
                    int num_mis_in_lpf_unit_height)

{
  bool bVar1;
  AV1LfMTInfo *lf_job_queue;
  int dir;
  int plane;
  int mi_row;
  int num_mis_in_lpf_unit_height_local;
  int lpf_opt_level_local;
  int *planes_to_lf_local;
  int stop_local;
  int start_local;
  AV1LfSync *lf_sync_local;
  
  lf_job_queue = lf_sync->job_queue;
  lf_sync->jobs_enqueued = 0;
  lf_sync->jobs_dequeued = 0;
  dir = 0;
  do {
    mi_row = start;
    if (1 < dir) {
      return;
    }
    for (; mi_row < stop; mi_row = num_mis_in_lpf_unit_height + mi_row) {
      for (plane = 0; plane < 3; plane = plane + 1) {
        if (lpf_opt_level == 2) {
          if (plane == 0) {
            bVar1 = *planes_to_lf == 0;
          }
          else if (plane == 1) {
            bVar1 = false;
            if (planes_to_lf[1] == 0) {
              bVar1 = planes_to_lf[2] == 0;
            }
          }
          else {
            if (plane != 2) goto LAB_00700fa7;
            bVar1 = true;
          }
        }
        else {
LAB_00700fa7:
          bVar1 = planes_to_lf[plane] == 0;
        }
        if ((!bVar1) && (planes_to_lf[plane] != 0)) {
          lf_job_queue->mi_row = mi_row;
          lf_job_queue->plane = plane;
          lf_job_queue->dir = dir;
          lf_job_queue->lpf_opt_level = lpf_opt_level;
          lf_job_queue = lf_job_queue + 1;
          lf_sync->jobs_enqueued = lf_sync->jobs_enqueued + 1;
        }
      }
    }
    dir = dir + 1;
  } while( true );
}

Assistant:

static inline void enqueue_lf_jobs(AV1LfSync *lf_sync, int start, int stop,
                                   const int planes_to_lf[MAX_MB_PLANE],
                                   int lpf_opt_level,
                                   int num_mis_in_lpf_unit_height) {
  int mi_row, plane, dir;
  AV1LfMTInfo *lf_job_queue = lf_sync->job_queue;
  lf_sync->jobs_enqueued = 0;
  lf_sync->jobs_dequeued = 0;

  // Launch all vertical jobs first, as they are blocking the horizontal ones.
  // Launch top row jobs for all planes first, in case the output can be
  // partially reconstructed row by row.
  for (dir = 0; dir < 2; ++dir) {
    for (mi_row = start; mi_row < stop; mi_row += num_mis_in_lpf_unit_height) {
      for (plane = 0; plane < MAX_MB_PLANE; ++plane) {
        if (skip_loop_filter_plane(planes_to_lf, plane, lpf_opt_level)) {
          continue;
        }
        if (!planes_to_lf[plane]) continue;
        lf_job_queue->mi_row = mi_row;
        lf_job_queue->plane = plane;
        lf_job_queue->dir = dir;
        lf_job_queue->lpf_opt_level = lpf_opt_level;
        lf_job_queue++;
        lf_sync->jobs_enqueued++;
      }
    }
  }
}